

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

int Abc_TtHieRetrieveOrInsert(Abc_TtHieMan_t *p,int level,word *pTruth,word *pResult)

{
  Vec_Mem_t *p_00;
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  word **ppwVar5;
  long lVar6;
  word *pwVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar13;
  ulong uVar14;
  ulong uVar12;
  
  iVar3 = -1;
  if (p != (Abc_TtHieMan_t *)0x0) {
    uVar12 = (ulong)(uint)level;
    if (((-1 < level) || (uVar9 = level + p->nLastLevel + 1, uVar12 = (ulong)uVar9, -1 < (int)uVar9)
        ) && (iVar10 = (int)uVar12, iVar10 <= p->nLastLevel)) {
      piVar4 = Vec_MemHashLookup(p->vTtMem[uVar12],pTruth);
      iVar3 = *piVar4;
      if (iVar3 == -1) {
        p_00 = p->vTtMem[uVar12];
        pVVar1 = p_00->vTable;
        if (pVVar1->nSize < p_00->nEntries) {
          uVar9 = Abc_PrimeCudd(pVVar1->nSize * 2);
          Vec_IntGrow(pVVar1,uVar9);
          uVar14 = 0;
          uVar13 = (ulong)uVar9;
          if ((int)uVar9 < 1) {
            uVar13 = uVar14;
          }
          for (; uVar13 != uVar14; uVar14 = uVar14 + 1) {
            pVVar1->pArray[uVar14] = -1;
          }
          pVVar1->nSize = uVar9;
          p_00->vNexts->nSize = 0;
          for (iVar3 = 0; iVar2 = p_00->nEntries, iVar3 < iVar2; iVar3 = iVar3 + 1) {
            pwVar7 = Vec_MemReadEntry(p_00,iVar3);
            if (pwVar7 == (word *)0x0) {
              iVar2 = p_00->nEntries;
              break;
            }
            piVar4 = Vec_MemHashLookup(p_00,pwVar7);
            if (*piVar4 != -1) {
              __assert_fail("*pSpot == -1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                            ,0x16f,"void Vec_MemHashResize(Vec_Mem_t *)");
            }
            pVVar1 = p_00->vNexts;
            *piVar4 = pVVar1->nSize;
            Vec_IntPush(pVVar1,-1);
          }
          if (iVar2 != p_00->vNexts->nSize) {
            __assert_fail("p->nEntries == Vec_IntSize(p->vNexts)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                          ,0x173,"void Vec_MemHashResize(Vec_Mem_t *)");
          }
        }
        piVar4 = Vec_MemHashLookup(p_00,pTruth);
        iVar3 = *piVar4;
        if (iVar3 == -1) {
          pVVar1 = p_00->vNexts;
          *piVar4 = pVVar1->nSize;
          Vec_IntPush(pVVar1,-1);
          uVar9 = p_00->nEntries;
          if ((int)uVar9 < 0) {
            __assert_fail("i >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                          ,0xd8,"word *Vec_MemGetEntry(Vec_Mem_t *, int)");
          }
          uVar11 = uVar9 >> ((byte)p_00->LogPageSze & 0x1f);
          iVar3 = p_00->iPage;
          if (iVar3 < (int)uVar11) {
            iVar2 = p_00->nPageAlloc;
            if (iVar2 <= (int)uVar11) {
              iVar8 = uVar11 + 0x20;
              if (iVar2 != 0) {
                iVar8 = iVar2 * 2;
              }
              p_00->nPageAlloc = iVar8;
              if (p_00->ppPages == (word **)0x0) {
                ppwVar5 = (word **)malloc((long)iVar8 * 8);
              }
              else {
                ppwVar5 = (word **)realloc(p_00->ppPages,(long)iVar8 * 8);
                iVar3 = p_00->iPage;
              }
              p_00->ppPages = ppwVar5;
            }
            for (lVar6 = (long)iVar3; lVar6 < (long)(ulong)uVar11; lVar6 = lVar6 + 1) {
              pwVar7 = (word *)malloc((long)(p_00->nEntrySize << ((byte)p_00->LogPageSze & 0x1f)) <<
                                      3);
              p_00->ppPages[lVar6 + 1] = pwVar7;
            }
            p_00->iPage = uVar11;
          }
          p_00->nEntries = uVar9 + 1;
          pwVar7 = Vec_MemReadEntry(p_00,uVar9);
          memmove(pwVar7,pTruth,(long)p_00->nEntrySize << 3);
          if (p_00->nEntries != p_00->vNexts->nSize) {
            __assert_fail("p->nEntries == Vec_IntSize(p->vNexts)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                          ,0x180,"int Vec_MemHashInsert(Vec_Mem_t *, word *)");
          }
          iVar3 = p_00->nEntries + -1;
        }
        p->vTruthId[uVar12] = iVar3;
        iVar2 = p->nLastLevel;
        if (iVar10 < iVar2) {
          return 0;
        }
      }
      else {
        iVar2 = p->nLastLevel;
      }
      if (iVar10 < iVar2) {
        iVar3 = Vec_IntEntry(p->vRepres[uVar12],iVar3);
      }
      for (uVar13 = 0; uVar13 != uVar12; uVar13 = uVar13 + 1) {
        pVVar1 = p->vRepres[uVar13];
        uVar9 = p->vTruthId[uVar13];
        uVar11 = pVVar1->nSize;
        if ((int)uVar9 < (int)uVar11) {
          uVar14 = (ulong)uVar11;
        }
        else {
          uVar14 = (long)(int)uVar9 + 1;
          iVar2 = pVVar1->nCap * 2;
          iVar8 = (int)uVar14;
          if ((iVar2 <= (int)uVar9) || (iVar8 = iVar2, pVVar1->nCap <= (int)uVar9)) {
            Vec_IntGrow(pVVar1,iVar8);
            uVar11 = pVVar1->nSize;
          }
          for (lVar6 = (long)(int)uVar11; lVar6 < (long)uVar14; lVar6 = lVar6 + 1) {
            pVVar1->pArray[lVar6] = 0;
          }
          pVVar1->nSize = (int)uVar14;
        }
        if (((int)uVar9 < 0) || ((int)uVar14 <= (int)uVar9)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        pVVar1->pArray[uVar9] = iVar3;
      }
      pwVar7 = Vec_MemReadEntry(p->vTtMem[p->nLastLevel],iVar3);
      iVar2 = p->nWords;
      if (iVar10 < p->nLastLevel) {
        iVar3 = 1;
      }
      else {
        iVar3 = Abc_TtEqual(pTruth,pwVar7,iVar2);
        if (iVar3 == 0) {
          __assert_fail("Abc_TtEqual(pTruth, pRepTruth, p->nWords)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                        ,0x51b,
                        "int Abc_TtHieRetrieveOrInsert(Abc_TtHieMan_t *, int, word *, word *)");
        }
        iVar3 = 0;
        if (pTruth == pResult) {
          return 0;
        }
      }
      Abc_TtCopy(pResult,pwVar7,iVar2,0);
    }
  }
  return iVar3;
}

Assistant:

int Abc_TtHieRetrieveOrInsert(Abc_TtHieMan_t * p, int level, word * pTruth, word * pResult)
{
    int i, iSpot, truthId;
    word * pRepTruth;
    if (!p) return -1;
    if (level < 0) level += p->nLastLevel + 1;
    if (level < 0 || level > p->nLastLevel) return -1;
    iSpot = *Vec_MemHashLookup(p->vTtMem[level], pTruth);
    if (iSpot == -1) {
        p->vTruthId[level] = Vec_MemHashInsert(p->vTtMem[level], pTruth);
        if (level < p->nLastLevel) return 0;
        iSpot = p->vTruthId[level];
    }
    // return the class representative
    if (level < p->nLastLevel)
        truthId = Vec_IntEntry(p->vRepres[level], iSpot);
    else
        truthId = iSpot;
    for (i = 0; i < level; i++)
        Vec_IntSetEntry(p->vRepres[i], p->vTruthId[i], truthId);

    pRepTruth = Vec_MemReadEntry(p->vTtMem[p->nLastLevel], truthId);
    if (level < p->nLastLevel) {
        Abc_TtCopy(pResult, pRepTruth, p->nWords, 0);
        return 1;
    }
    assert(Abc_TtEqual(pTruth, pRepTruth, p->nWords));
    if (pTruth != pResult)
        Abc_TtCopy(pResult, pRepTruth, p->nWords, 0);
    return 0;
}